

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * __thiscall
absl::lts_20250127::
StrCat<std::basic_string_view<char,std::char_traits<char>>,char[23],std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string,char[45]>
          (string *__return_storage_ptr__,lts_20250127 *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,basic_string_view<char,_std::char_traits<char>_> *args,
          char (*args_1) [23],basic_string_view<char,_std::char_traits<char>_> *args_2,
          char (*args_3) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          char (*args_5) [45])

{
  size_type sVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_e0;
  undefined8 uStack_d8;
  size_t local_d0;
  char *pcStack_c8;
  size_t local_c0;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_a8;
  size_t local_a0;
  char *pcStack_98;
  size_t local_90;
  char *pcStack_88;
  string_view local_80;
  undefined8 local_70;
  undefined8 uStack_68;
  string_view local_60;
  size_type local_50;
  undefined8 local_48;
  string_view local_40;
  
  local_e0 = *(undefined8 *)this;
  uStack_d8 = *(undefined8 *)(this + 8);
  local_d0 = (a->piece_)._M_len;
  pcStack_c8 = (a->piece_)._M_str;
  local_c0 = (b->piece_)._M_len;
  pcStack_b8 = (b->piece_)._M_str;
  local_b0 = (c->piece_)._M_len;
  pcStack_a8 = (c->piece_)._M_str;
  local_a0 = (d->piece_)._M_len;
  pcStack_98 = (d->piece_)._M_str;
  local_90 = (e->piece_)._M_len;
  pcStack_88 = (e->piece_)._M_str;
  local_80 = NullSafeStringView((Nullable<const_char_*>)args);
  local_70 = *(undefined8 *)*args_1;
  uStack_68 = *(undefined8 *)(*args_1 + 8);
  local_60 = NullSafeStringView((Nullable<const_char_*>)args_2);
  local_48 = *(undefined8 *)args_3;
  sVar1 = *(size_type *)(args_3 + 2);
  local_50 = sVar1;
  local_40 = NullSafeStringView((Nullable<const_char_*>)args_4);
  pieces._M_len = sVar1;
  pieces._M_array = (iterator)0xb;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_e0,pieces);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}